

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

uint get_num_refs_to_disable
               (AV1_COMP *cpi,int *ref_frame_flags,uint *ref_display_order_hint,
               uint cur_frame_display_index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FIRSTPASS_STATS *pFVar4;
  int in_ECX;
  long in_RDX;
  uint *in_RSI;
  AV1_COMP *in_RDI;
  double coded_error_per_mb;
  FIRSTPASS_STATS *this_frame_stats;
  int last2_frame_dist;
  uint num_refs_to_disable;
  uint local_20;
  
  local_20 = 0;
  uVar1 = local_20;
  if (2 < (in_RDI->sf).inter_sf.selective_ref_frame) {
    uVar2 = 1;
    local_20 = 1;
    if ((in_RDI->sf).inter_sf.selective_ref_frame < 6) {
      uVar1 = uVar2;
      if (((in_RDI->sf).inter_sf.selective_ref_frame == 5) && (uVar1 = local_20, (*in_RSI & 2) != 0)
         ) {
        iVar3 = av1_encoder_get_relative_dist(*(int *)(in_RDX + 4),in_ECX);
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if (iVar3 < 3) {
          iVar3 = is_stat_consumption_stage_twopass(in_RDI);
          uVar1 = uVar2;
          if ((iVar3 != 0) &&
             (pFVar4 = read_one_frame_stats(&in_RDI->ppi->twopass,in_ECX),
             pFVar4->coded_error < 100.0)) {
            uVar1 = 2;
          }
        }
        else {
          uVar1 = 2;
        }
      }
    }
    else {
      uVar1 = 3;
    }
  }
  local_20 = uVar1;
  return local_20;
}

Assistant:

static inline unsigned int get_num_refs_to_disable(
    const AV1_COMP *cpi, const int *ref_frame_flags,
    const unsigned int *ref_display_order_hint,
    unsigned int cur_frame_display_index) {
  unsigned int num_refs_to_disable = 0;
  if (cpi->sf.inter_sf.selective_ref_frame >= 3) {
    num_refs_to_disable++;
    if (cpi->sf.inter_sf.selective_ref_frame >= 6) {
      // Disable LAST2_FRAME  and ALTREF2_FRAME
      num_refs_to_disable += 2;
    } else if (cpi->sf.inter_sf.selective_ref_frame == 5 &&
               *ref_frame_flags & av1_ref_frame_flag_list[LAST2_FRAME]) {
      const int last2_frame_dist = av1_encoder_get_relative_dist(
          ref_display_order_hint[LAST2_FRAME - LAST_FRAME],
          cur_frame_display_index);
      // Disable LAST2_FRAME if it is a temporally distant frame
      if (abs(last2_frame_dist) > 2) {
        num_refs_to_disable++;
      }
#if !CONFIG_REALTIME_ONLY
      else if (is_stat_consumption_stage_twopass(cpi)) {
        const FIRSTPASS_STATS *const this_frame_stats =
            read_one_frame_stats(&cpi->ppi->twopass, cur_frame_display_index);
        const double coded_error_per_mb = this_frame_stats->coded_error;
        // Disable LAST2_FRAME if the coded error of the current frame based on
        // first pass stats is very low.
        if (coded_error_per_mb < 100.0) num_refs_to_disable++;
      }
#endif  // CONFIG_REALTIME_ONLY
    }
  }
  return num_refs_to_disable;
}